

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h1.c
# Opt level: O1

int rops_pt_init_destroy_h1
              (lws_context *context,lws_context_creation_info *info,lws_context_per_thread *pt,
              int destroy)

{
  return 0;
}

Assistant:

int
rops_pt_init_destroy_h1(struct lws_context *context,
		    const struct lws_context_creation_info *info,
		    struct lws_context_per_thread *pt, int destroy)
{
	/*
	 * We only want to do this once... we will do it if no h2 support
	 * otherwise let h2 ops do it.
	 */
#if !defined(LWS_ROLE_H2) && defined(LWS_WITH_SERVER)
	if (!destroy) {

		pt->sul_ah_lifecheck.cb = lws_sul_http_ah_lifecheck;

		__lws_sul_insert_us(&pt->pt_sul_owner[LWSSULLI_MISS_IF_SUSPENDED],
				 &pt->sul_ah_lifecheck, 30 * LWS_US_PER_SEC);
	} else
		lws_dll2_remove(&pt->sul_ah_lifecheck.list);
#endif

	return 0;
}